

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectangularVolumeRecord3.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::RectangularVolumeRecord3::RectangularVolumeRecord3
          (RectangularVolumeRecord3 *this,KUINT8 Index,WorldCoordinates *CenterLocation,
          Vector *RectangleLength,EulerAngles *Orientation)

{
  KFLOAT64 KVar1;
  KFLOAT32 KVar2;
  
  EnvironmentRecord::EnvironmentRecord(&this->super_EnvironmentRecord);
  (this->super_EnvironmentRecord).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__RectangularVolumeRecord3_003268f0;
  (this->m_CentLocation).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00324d88;
  KVar1 = CenterLocation->m_f64Y;
  (this->m_CentLocation).m_f64X = CenterLocation->m_f64X;
  (this->m_CentLocation).m_f64Y = KVar1;
  (this->m_CentLocation).m_f64Z = CenterLocation->m_f64Z;
  (this->m_RecLength).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00324d30;
  KVar2 = RectangleLength->m_f32Y;
  (this->m_RecLength).m_f32X = RectangleLength->m_f32X;
  (this->m_RecLength).m_f32Y = KVar2;
  (this->m_RecLength).m_f32Z = RectangleLength->m_f32Z;
  (this->m_Ori).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__EulerAngles_00324810;
  KVar2 = Orientation->m_f32Theta;
  (this->m_Ori).m_f32Psi = Orientation->m_f32Psi;
  (this->m_Ori).m_f32Theta = KVar2;
  (this->m_Ori).m_f32Phi = Orientation->m_f32Phi;
  (this->super_EnvironmentRecord).m_ui8Index = Index;
  (this->super_EnvironmentRecord).m_ui32EnvRecTyp = 0x5000000;
  (this->super_EnvironmentRecord).m_ui16Length = 0x180;
  return;
}

Assistant:

RectangularVolumeRecord3::RectangularVolumeRecord3( KUINT8 Index, const WorldCoordinates & CenterLocation, const Vector & RectangleLength,
        const EulerAngles & Orientation ) :
    m_CentLocation( CenterLocation ),
    m_RecLength( RectangleLength ),
    m_Ori( Orientation )
{
    m_ui8Index = Index;
    m_ui32EnvRecTyp = RectangularVolumeRecord3Type;
    m_ui16Length = ( RECTANGLE_VOLUME_RECORD_3_SIZE - ENVIRONMENT_RECORD_SIZE ) * 8;
}